

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::TransformFeedback::DefaultsTest::testBuffersDimensions
          (DefaultsTest *this)

{
  ostringstream *poVar1;
  int iVar2;
  deUint32 dVar3;
  int iVar4;
  undefined4 extraout_var;
  GLuint GVar5;
  GLint64 buffer_start;
  GLint64 local_1b8;
  undefined1 local_1b0 [384];
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  GVar5 = 0;
  do {
    iVar4 = this->m_xfb_indexed_binding_points_count;
    if (iVar4 <= (int)GVar5) {
      GVar5 = 0;
      while( true ) {
        if (iVar4 <= (int)GVar5) {
          return true;
        }
        local_1b8 = -1;
        (*this->m_gl_getTransformFeedbacki64_v)(this->m_xfb_dsa,0x8c85,GVar5,&local_1b8);
        dVar3 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
        glu::checkError(dVar3,"glGetTransformFeedbacki_v have failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                        ,0x1a2);
        if (local_1b8 != 0) break;
        GVar5 = GVar5 + 1;
        iVar4 = this->m_xfb_indexed_binding_points_count;
      }
      if (local_1b8 == -1) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::operator<<((ostream *)(local_1b0 + 8),
                        "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_SIZE has not returned anything and error has not been generated."
                       );
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,
                        "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_SIZE has returned "
                       );
        std::ostream::_M_insert<long>((long)poVar1);
        std::operator<<((ostream *)poVar1,", however 0 is expected.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
LAB_00b25cf5:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      return false;
    }
    local_1b8 = -1;
    (*this->m_gl_getTransformFeedbacki64_v)(this->m_xfb_dsa,0x8c84,GVar5,&local_1b8);
    dVar3 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
    glu::checkError(dVar3,"glGetTransformFeedbacki_v have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                    ,0x17f);
    if (local_1b8 != 0) {
      if (local_1b8 == -1) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::operator<<((ostream *)(local_1b0 + 8),
                        "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_START has not returned anything and error has not been generated."
                       );
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,
                        "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_START has returned "
                       );
        std::ostream::_M_insert<long>((long)poVar1);
        std::operator<<((ostream *)poVar1,", however 0 is expected.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      goto LAB_00b25cf5;
    }
    GVar5 = GVar5 + 1;
  } while( true );
}

Assistant:

bool DefaultsTest::testBuffersDimensions()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check default buffers' start value. */
	for (glw::GLint i = 0; i < m_xfb_indexed_binding_points_count; ++i)
	{
		glw::GLint64 buffer_start = -1;

		m_gl_getTransformFeedbacki64_v(m_xfb_dsa, GL_TRANSFORM_FEEDBACK_BUFFER_START, i, &buffer_start);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTransformFeedbacki_v have failed");

		if (-1 == buffer_start)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_START has not returned "
				   "anything and error has not been generated."
				<< tcu::TestLog::EndMessage;

			return false;
		}
		else
		{
			if (0 != buffer_start)
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_START has returned "
					<< buffer_start << ", however 0 is expected." << tcu::TestLog::EndMessage;

				return false;
			}
		}
	}

	/** @brief Check default buffers' size value.
	 *
	 *  @note The function may throw if unexpected error has occured.
	 */
	for (glw::GLint i = 0; i < m_xfb_indexed_binding_points_count; ++i)
	{
		glw::GLint64 buffer_size = -1;

		m_gl_getTransformFeedbacki64_v(m_xfb_dsa, GL_TRANSFORM_FEEDBACK_BUFFER_SIZE, i, &buffer_size);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTransformFeedbacki_v have failed");

		if (-1 == buffer_size)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_SIZE has not returned "
				   "anything and error has not been generated."
				<< tcu::TestLog::EndMessage;

			return false;
		}
		else
		{
			if (0 != buffer_size)
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_SIZE has returned "
					<< buffer_size << ", however 0 is expected." << tcu::TestLog::EndMessage;

				return false;
			}
		}
	}

	return true;
}